

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  ulong uVar37;
  long lVar38;
  Scene *pSVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 (*pauVar45) [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar52 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar77;
  float fVar78;
  undefined1 auVar74 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  float fVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [64];
  float fVar101;
  float fVar103;
  undefined1 auVar102 [32];
  float fVar104;
  undefined4 uVar105;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar121 [32];
  float fVar127;
  float fVar129;
  undefined1 auVar128 [32];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar131 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_29e0 [16];
  undefined1 (*local_29c8) [16];
  long local_29c0;
  ulong local_29b8;
  RTCFilterFunctionNArguments local_29b0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  Scene *local_2900;
  undefined1 auStack_28f8 [24];
  undefined1 local_28e0 [32];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  RTCHitN local_2890 [16];
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined4 local_2850;
  undefined4 uStack_284c;
  undefined4 uStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  undefined4 uStack_2624;
  undefined1 local_2620 [32];
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar45 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar105 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2500._4_4_ = uVar105;
  local_2500._0_4_ = uVar105;
  local_2500._8_4_ = uVar105;
  local_2500._12_4_ = uVar105;
  local_2500._16_4_ = uVar105;
  local_2500._20_4_ = uVar105;
  local_2500._24_4_ = uVar105;
  local_2500._28_4_ = uVar105;
  auVar88 = ZEXT3264(local_2500);
  uVar105 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2520._4_4_ = uVar105;
  local_2520._0_4_ = uVar105;
  local_2520._8_4_ = uVar105;
  local_2520._12_4_ = uVar105;
  local_2520._16_4_ = uVar105;
  local_2520._20_4_ = uVar105;
  local_2520._24_4_ = uVar105;
  local_2520._28_4_ = uVar105;
  auVar89 = ZEXT3264(local_2520);
  uVar105 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2540._4_4_ = uVar105;
  local_2540._0_4_ = uVar105;
  local_2540._8_4_ = uVar105;
  local_2540._12_4_ = uVar105;
  local_2540._16_4_ = uVar105;
  local_2540._20_4_ = uVar105;
  local_2540._24_4_ = uVar105;
  local_2540._28_4_ = uVar105;
  auVar94 = ZEXT3264(local_2540);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar127 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar130 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar101 = fVar120 * 0.99999964;
  fVar104 = fVar127 * 0.99999964;
  fVar113 = fVar130 * 0.99999964;
  fVar120 = fVar120 * 1.0000004;
  fVar127 = fVar127 * 1.0000004;
  fVar130 = fVar130 * 1.0000004;
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_29b8 = uVar43 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_28e0._4_4_ = iVar1;
  local_28e0._0_4_ = iVar1;
  local_28e0._8_4_ = iVar1;
  local_28e0._12_4_ = iVar1;
  local_28e0._16_4_ = iVar1;
  local_28e0._20_4_ = iVar1;
  local_28e0._24_4_ = iVar1;
  local_28e0._28_4_ = iVar1;
  auVar84 = ZEXT3264(local_28e0);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar50 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_2620._16_16_ = mm_lookupmask_ps._240_16_;
  local_2620._0_16_ = mm_lookupmask_ps._0_16_;
  local_29c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = 0x3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar65._16_4_ = 0x3f800000;
  auVar65._20_4_ = 0x3f800000;
  auVar65._24_4_ = 0x3f800000;
  auVar65._28_4_ = 0x3f800000;
  auVar53._8_4_ = 0xbf800000;
  auVar53._0_8_ = 0xbf800000bf800000;
  auVar53._12_4_ = 0xbf800000;
  auVar53._16_4_ = 0xbf800000;
  auVar53._20_4_ = 0xbf800000;
  auVar53._24_4_ = 0xbf800000;
  auVar53._28_4_ = 0xbf800000;
  _local_2640 = vblendvps_avx(auVar65,auVar53,local_2620);
  local_2560 = fVar101;
  fStack_255c = fVar101;
  fStack_2558 = fVar101;
  fStack_2554 = fVar101;
  fStack_2550 = fVar101;
  fStack_254c = fVar101;
  fStack_2548 = fVar101;
  fStack_2544 = fVar101;
  local_2580 = fVar104;
  fStack_257c = fVar104;
  fStack_2578 = fVar104;
  fStack_2574 = fVar104;
  fStack_2570 = fVar104;
  fStack_256c = fVar104;
  fStack_2568 = fVar104;
  fStack_2564 = fVar104;
  local_25a0 = fVar113;
  fStack_259c = fVar113;
  fStack_2598 = fVar113;
  fStack_2594 = fVar113;
  fStack_2590 = fVar113;
  fStack_258c = fVar113;
  fStack_2588 = fVar113;
  fStack_2584 = fVar113;
  local_25c0 = fVar120;
  fStack_25bc = fVar120;
  fStack_25b8 = fVar120;
  fStack_25b4 = fVar120;
  fStack_25b0 = fVar120;
  fStack_25ac = fVar120;
  fStack_25a8 = fVar120;
  fStack_25a4 = fVar120;
  local_25e0 = fVar127;
  fStack_25dc = fVar127;
  fStack_25d8 = fVar127;
  fStack_25d4 = fVar127;
  fStack_25d0 = fVar127;
  fStack_25cc = fVar127;
  fStack_25c8 = fVar127;
  fStack_25c4 = fVar127;
  local_2600 = fVar130;
  fStack_25fc = fVar130;
  fStack_25f8 = fVar130;
  fStack_25f4 = fVar130;
  fStack_25f0 = fVar130;
  fStack_25ec = fVar130;
  fStack_25e8 = fVar130;
  fStack_25e4 = fVar130;
  fVar103 = fVar101;
  fVar90 = fVar101;
  fVar77 = fVar101;
  fVar78 = fVar101;
  fVar79 = fVar101;
  fVar80 = fVar101;
  fVar81 = fVar104;
  fVar82 = fVar104;
  fVar109 = fVar104;
  fVar110 = fVar104;
  fVar111 = fVar104;
  fVar112 = fVar104;
  fVar114 = fVar113;
  fVar115 = fVar113;
  fVar116 = fVar113;
  fVar117 = fVar113;
  fVar118 = fVar113;
  fVar119 = fVar113;
  fVar122 = fVar120;
  fVar123 = fVar120;
  fVar124 = fVar120;
  fVar125 = fVar120;
  fVar126 = fVar120;
  fVar95 = fVar120;
  fVar96 = fVar127;
  fVar97 = fVar127;
  fVar98 = fVar127;
  fVar99 = fVar127;
  fVar100 = fVar127;
  fVar129 = fVar127;
  fVar132 = fVar130;
  fVar133 = fVar130;
  fVar134 = fVar130;
  fVar135 = fVar130;
  fVar136 = fVar130;
  fVar137 = fVar130;
LAB_016765a4:
  do {
    do {
      if (pauVar45 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar35 = pauVar45 + -1;
      pauVar45 = pauVar45 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar35 + 8));
    uVar37 = *(ulong *)*pauVar45;
    while ((uVar37 & 8) == 0) {
      auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar43),auVar88._0_32_);
      auVar59._4_4_ = fVar103 * auVar53._4_4_;
      auVar59._0_4_ = fVar101 * auVar53._0_4_;
      auVar59._8_4_ = fVar90 * auVar53._8_4_;
      auVar59._12_4_ = fVar77 * auVar53._12_4_;
      auVar59._16_4_ = fVar78 * auVar53._16_4_;
      auVar59._20_4_ = fVar79 * auVar53._20_4_;
      auVar59._24_4_ = fVar80 * auVar53._24_4_;
      auVar59._28_4_ = auVar53._28_4_;
      auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar42),auVar89._0_32_);
      auVar6._4_4_ = fVar81 * auVar53._4_4_;
      auVar6._0_4_ = fVar104 * auVar53._0_4_;
      auVar6._8_4_ = fVar82 * auVar53._8_4_;
      auVar6._12_4_ = fVar109 * auVar53._12_4_;
      auVar6._16_4_ = fVar110 * auVar53._16_4_;
      auVar6._20_4_ = fVar111 * auVar53._20_4_;
      auVar6._24_4_ = fVar112 * auVar53._24_4_;
      auVar6._28_4_ = auVar53._28_4_;
      auVar53 = vmaxps_avx(auVar59,auVar6);
      auVar65 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar44),auVar94._0_32_);
      auVar7._4_4_ = fVar114 * auVar65._4_4_;
      auVar7._0_4_ = fVar113 * auVar65._0_4_;
      auVar7._8_4_ = fVar115 * auVar65._8_4_;
      auVar7._12_4_ = fVar116 * auVar65._12_4_;
      auVar7._16_4_ = fVar117 * auVar65._16_4_;
      auVar7._20_4_ = fVar118 * auVar65._20_4_;
      auVar7._24_4_ = fVar119 * auVar65._24_4_;
      auVar7._28_4_ = auVar65._28_4_;
      auVar65 = vmaxps_avx(auVar7,auVar84._0_32_);
      local_2800 = vmaxps_avx(auVar53,auVar65);
      auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + local_29b8),auVar88._0_32_);
      auVar8._4_4_ = fVar122 * auVar53._4_4_;
      auVar8._0_4_ = fVar120 * auVar53._0_4_;
      auVar8._8_4_ = fVar123 * auVar53._8_4_;
      auVar8._12_4_ = fVar124 * auVar53._12_4_;
      auVar8._16_4_ = fVar125 * auVar53._16_4_;
      auVar8._20_4_ = fVar126 * auVar53._20_4_;
      auVar8._24_4_ = fVar95 * auVar53._24_4_;
      auVar8._28_4_ = auVar53._28_4_;
      auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar42 ^ 0x20)),auVar89._0_32_);
      auVar9._4_4_ = fVar96 * auVar53._4_4_;
      auVar9._0_4_ = fVar127 * auVar53._0_4_;
      auVar9._8_4_ = fVar97 * auVar53._8_4_;
      auVar9._12_4_ = fVar98 * auVar53._12_4_;
      auVar9._16_4_ = fVar99 * auVar53._16_4_;
      auVar9._20_4_ = fVar100 * auVar53._20_4_;
      auVar9._24_4_ = fVar129 * auVar53._24_4_;
      auVar9._28_4_ = auVar53._28_4_;
      auVar53 = vminps_avx(auVar8,auVar9);
      auVar65 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar44 ^ 0x20)),auVar94._0_32_);
      auVar10._4_4_ = fVar132 * auVar65._4_4_;
      auVar10._0_4_ = fVar130 * auVar65._0_4_;
      auVar10._8_4_ = fVar133 * auVar65._8_4_;
      auVar10._12_4_ = fVar134 * auVar65._12_4_;
      auVar10._16_4_ = fVar135 * auVar65._16_4_;
      auVar10._20_4_ = fVar136 * auVar65._20_4_;
      auVar10._24_4_ = fVar137 * auVar65._24_4_;
      auVar10._28_4_ = auVar65._28_4_;
      auVar65 = vminps_avx(auVar10,auVar50._0_32_);
      auVar53 = vminps_avx(auVar53,auVar65);
      auVar53 = vcmpps_avx(local_2800,auVar53,2);
      uVar31 = vmovmskps_avx(auVar53);
      if (uVar31 == 0) goto LAB_016765a4;
      uVar31 = uVar31 & 0xff;
      uVar40 = uVar37 & 0xfffffffffffffff0;
      lVar38 = 0;
      for (uVar37 = (ulong)uVar31; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar37 = *(ulong *)(uVar40 + lVar38 * 8);
      uVar31 = uVar31 - 1 & uVar31;
      uVar33 = (ulong)uVar31;
      if (uVar31 != 0) {
        uVar32 = *(uint *)(local_2800 + lVar38 * 4);
        lVar38 = 0;
        for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar38 = lVar38 + 1;
        }
        uVar31 = uVar31 - 1 & uVar31;
        uVar34 = (ulong)uVar31;
        uVar33 = *(ulong *)(uVar40 + lVar38 * 8);
        uVar3 = *(uint *)(local_2800 + lVar38 * 4);
        if (uVar31 == 0) {
          if (uVar32 < uVar3) {
            *(ulong *)*pauVar45 = uVar33;
            *(uint *)(*pauVar45 + 8) = uVar3;
            pauVar45 = pauVar45 + 1;
          }
          else {
            *(ulong *)*pauVar45 = uVar37;
            *(uint *)(*pauVar45 + 8) = uVar32;
            uVar37 = uVar33;
            pauVar45 = pauVar45 + 1;
          }
        }
        else {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar37;
          auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar32));
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar33;
          auVar61 = vpunpcklqdq_avx(auVar61,ZEXT416(uVar3));
          lVar38 = 0;
          for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar31 = uVar31 - 1 & uVar31;
          uVar37 = (ulong)uVar31;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)(uVar40 + lVar38 * 8);
          auVar52 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_2800 + lVar38 * 4)));
          auVar64 = vpcmpgtd_avx(auVar61,auVar51);
          if (uVar31 == 0) {
            auVar74 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar61,auVar51,auVar74);
            auVar51 = vblendvps_avx(auVar51,auVar61,auVar74);
            auVar61 = vpcmpgtd_avx(auVar52,auVar64);
            auVar74 = vpshufd_avx(auVar61,0xaa);
            auVar61 = vblendvps_avx(auVar52,auVar64,auVar74);
            auVar64 = vblendvps_avx(auVar64,auVar52,auVar74);
            auVar52 = vpcmpgtd_avx(auVar64,auVar51);
            auVar74 = vpshufd_avx(auVar52,0xaa);
            auVar52 = vblendvps_avx(auVar64,auVar51,auVar74);
            auVar51 = vblendvps_avx(auVar51,auVar64,auVar74);
            *pauVar45 = auVar51;
            pauVar45[1] = auVar52;
            uVar37 = auVar61._0_8_;
            pauVar45 = pauVar45 + 2;
          }
          else {
            lVar38 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar37 = (ulong)uVar31;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)(uVar40 + lVar38 * 8);
            auVar74 = vpunpcklqdq_avx(auVar74,ZEXT416(*(uint *)(local_2800 + lVar38 * 4)));
            if (uVar31 == 0) {
              auVar46 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar61,auVar51,auVar46);
              auVar51 = vblendvps_avx(auVar51,auVar61,auVar46);
              auVar61 = vpcmpgtd_avx(auVar74,auVar52);
              auVar46 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar74,auVar52,auVar46);
              auVar52 = vblendvps_avx(auVar52,auVar74,auVar46);
              auVar74 = vpcmpgtd_avx(auVar52,auVar51);
              auVar46 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar52,auVar51,auVar46);
              auVar51 = vblendvps_avx(auVar51,auVar52,auVar46);
              auVar52 = vpcmpgtd_avx(auVar61,auVar64);
              auVar46 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar61,auVar64,auVar46);
              auVar61 = vblendvps_avx(auVar64,auVar61,auVar46);
              auVar64 = vpcmpgtd_avx(auVar74,auVar61);
              auVar46 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar74,auVar61,auVar46);
              auVar61 = vblendvps_avx(auVar61,auVar74,auVar46);
              *pauVar45 = auVar51;
              pauVar45[1] = auVar61;
              pauVar45[2] = auVar64;
              uVar37 = auVar52._0_8_;
              pauVar35 = pauVar45 + 3;
            }
            else {
              *pauVar45 = auVar51;
              pauVar45[1] = auVar61;
              pauVar45[2] = auVar52;
              pauVar35 = pauVar45 + 3;
              pauVar45[3] = auVar74;
              do {
                lVar38 = 0;
                for (uVar33 = uVar37; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000)
                {
                  lVar38 = lVar38 + 1;
                }
                auVar52._8_8_ = 0;
                auVar52._0_8_ = *(ulong *)(uVar40 + lVar38 * 8);
                auVar51 = vpunpcklqdq_avx(auVar52,ZEXT416(*(uint *)(local_2800 + lVar38 * 4)));
                pauVar35[1] = auVar51;
                pauVar35 = pauVar35 + 1;
                uVar37 = uVar37 - 1 & uVar37;
              } while (uVar37 != 0);
              lVar38 = 0;
              while (pauVar35 != pauVar45) {
                auVar51 = pauVar45[1];
                uVar31 = vextractps_avx(auVar51,2);
                for (lVar41 = 0x10;
                    (lVar38 != lVar41 && (*(uint *)(pauVar45[-1] + lVar41 + 8) < uVar31));
                    lVar41 = lVar41 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar45 + lVar41) =
                       *(undefined1 (*) [16])(pauVar45[-1] + lVar41);
                }
                *(undefined1 (*) [16])(*pauVar45 + lVar41) = auVar51;
                lVar38 = lVar38 + -0x10;
                pauVar45 = pauVar45 + 1;
              }
              uVar37 = *(ulong *)*pauVar35;
            }
            auVar84 = ZEXT3264(local_28e0);
            pauVar45 = pauVar35;
          }
        }
      }
    }
    local_29c0 = (ulong)((uint)uVar37 & 0xf) - 8;
    uVar37 = uVar37 & 0xfffffffffffffff0;
    for (lVar38 = 0; lVar38 != local_29c0; lVar38 = lVar38 + 1) {
      lVar36 = lVar38 * 0xe0;
      lVar41 = uVar37 + 0xd0 + lVar36;
      local_28c0 = *(undefined8 *)(lVar41 + 0x10);
      uStack_28b8 = *(undefined8 *)(lVar41 + 0x18);
      lVar41 = uVar37 + 0xc0 + lVar36;
      local_23c0 = *(undefined8 *)(lVar41 + 0x10);
      uStack_23b8 = *(undefined8 *)(lVar41 + 0x18);
      uStack_23b0 = local_23c0;
      uStack_23a8 = uStack_23b8;
      uStack_28b0 = local_28c0;
      uStack_28a8 = uStack_28b8;
      auVar66._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x60 + lVar36);
      auVar66._0_16_ = *(undefined1 (*) [16])(uVar37 + lVar36);
      auVar54._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x70 + lVar36);
      auVar54._0_16_ = *(undefined1 (*) [16])(uVar37 + 0x10 + lVar36);
      auVar62._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x80 + lVar36);
      auVar62._0_16_ = *(undefined1 (*) [16])(uVar37 + 0x20 + lVar36);
      auVar51 = *(undefined1 (*) [16])(uVar37 + 0x30 + lVar36);
      auVar83._16_16_ = auVar51;
      auVar83._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar37 + 0x40 + lVar36);
      auVar69._16_16_ = auVar51;
      auVar69._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar37 + 0x50 + lVar36);
      auVar75._16_16_ = auVar51;
      auVar75._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar37 + 0x90 + lVar36);
      auVar85._16_16_ = auVar51;
      auVar85._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar37 + 0xa0 + lVar36);
      auVar131._16_16_ = auVar51;
      auVar131._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar37 + 0xb0 + lVar36);
      auVar47._16_16_ = auVar51;
      auVar47._0_16_ = auVar51;
      uVar105 = *(undefined4 *)(ray + k * 4);
      auVar106._4_4_ = uVar105;
      auVar106._0_4_ = uVar105;
      auVar106._8_4_ = uVar105;
      auVar106._12_4_ = uVar105;
      auVar106._16_4_ = uVar105;
      auVar106._20_4_ = uVar105;
      auVar106._24_4_ = uVar105;
      auVar106._28_4_ = uVar105;
      uVar105 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar121._4_4_ = uVar105;
      auVar121._0_4_ = uVar105;
      auVar121._8_4_ = uVar105;
      auVar121._12_4_ = uVar105;
      auVar121._16_4_ = uVar105;
      auVar121._20_4_ = uVar105;
      auVar121._24_4_ = uVar105;
      auVar121._28_4_ = uVar105;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar128._4_4_ = uVar2;
      auVar128._0_4_ = uVar2;
      auVar128._8_4_ = uVar2;
      auVar128._12_4_ = uVar2;
      auVar128._16_4_ = uVar2;
      auVar128._20_4_ = uVar2;
      auVar128._24_4_ = uVar2;
      auVar128._28_4_ = uVar2;
      local_2980 = vsubps_avx(auVar66,auVar106);
      auVar6 = vsubps_avx(auVar54,auVar121);
      auVar53 = vsubps_avx(auVar62,auVar128);
      auVar65 = vsubps_avx(auVar83,auVar106);
      auVar59 = vsubps_avx(auVar69,auVar121);
      auVar7 = vsubps_avx(auVar75,auVar128);
      auVar8 = vsubps_avx(auVar85,auVar106);
      auVar9 = vsubps_avx(auVar131,auVar121);
      auVar10 = vsubps_avx(auVar47,auVar128);
      auVar47 = vsubps_avx(auVar8,local_2980);
      local_2400 = vsubps_avx(auVar9,auVar6);
      local_23e0 = vsubps_avx(auVar10,auVar53);
      auVar48._0_4_ = local_2980._0_4_ + auVar8._0_4_;
      auVar48._4_4_ = local_2980._4_4_ + auVar8._4_4_;
      auVar48._8_4_ = local_2980._8_4_ + auVar8._8_4_;
      auVar48._12_4_ = local_2980._12_4_ + auVar8._12_4_;
      auVar48._16_4_ = local_2980._16_4_ + auVar8._16_4_;
      auVar48._20_4_ = local_2980._20_4_ + auVar8._20_4_;
      auVar48._24_4_ = local_2980._24_4_ + auVar8._24_4_;
      auVar48._28_4_ = local_2980._28_4_ + auVar8._28_4_;
      auVar86._0_4_ = auVar9._0_4_ + auVar6._0_4_;
      auVar86._4_4_ = auVar9._4_4_ + auVar6._4_4_;
      auVar86._8_4_ = auVar9._8_4_ + auVar6._8_4_;
      auVar86._12_4_ = auVar9._12_4_ + auVar6._12_4_;
      auVar86._16_4_ = auVar9._16_4_ + auVar6._16_4_;
      auVar86._20_4_ = auVar9._20_4_ + auVar6._20_4_;
      auVar86._24_4_ = auVar9._24_4_ + auVar6._24_4_;
      auVar86._28_4_ = auVar9._28_4_ + auVar6._28_4_;
      fVar120 = auVar53._0_4_;
      auVar70._0_4_ = auVar10._0_4_ + fVar120;
      fVar127 = auVar53._4_4_;
      auVar70._4_4_ = auVar10._4_4_ + fVar127;
      fVar130 = auVar53._8_4_;
      auVar70._8_4_ = auVar10._8_4_ + fVar130;
      fVar101 = auVar53._12_4_;
      auVar70._12_4_ = auVar10._12_4_ + fVar101;
      fVar104 = auVar53._16_4_;
      auVar70._16_4_ = auVar10._16_4_ + fVar104;
      fVar113 = auVar53._20_4_;
      auVar70._20_4_ = auVar10._20_4_ + fVar113;
      fVar103 = auVar53._24_4_;
      auVar70._24_4_ = auVar10._24_4_ + fVar103;
      fVar95 = auVar10._28_4_;
      auVar70._28_4_ = fVar95 + auVar53._28_4_;
      auVar11._4_4_ = local_23e0._4_4_ * auVar86._4_4_;
      auVar11._0_4_ = local_23e0._0_4_ * auVar86._0_4_;
      auVar11._8_4_ = local_23e0._8_4_ * auVar86._8_4_;
      auVar11._12_4_ = local_23e0._12_4_ * auVar86._12_4_;
      auVar11._16_4_ = local_23e0._16_4_ * auVar86._16_4_;
      auVar11._20_4_ = local_23e0._20_4_ * auVar86._20_4_;
      auVar11._24_4_ = local_23e0._24_4_ * auVar86._24_4_;
      auVar11._28_4_ = uVar105;
      auVar61 = vfmsub231ps_fma(auVar11,local_2400,auVar70);
      auVar12._4_4_ = auVar47._4_4_ * auVar70._4_4_;
      auVar12._0_4_ = auVar47._0_4_ * auVar70._0_4_;
      auVar12._8_4_ = auVar47._8_4_ * auVar70._8_4_;
      auVar12._12_4_ = auVar47._12_4_ * auVar70._12_4_;
      auVar12._16_4_ = auVar47._16_4_ * auVar70._16_4_;
      auVar12._20_4_ = auVar47._20_4_ * auVar70._20_4_;
      auVar12._24_4_ = auVar47._24_4_ * auVar70._24_4_;
      auVar12._28_4_ = auVar70._28_4_;
      auVar51 = vfmsub231ps_fma(auVar12,local_23e0,auVar48);
      auVar13._4_4_ = local_2400._4_4_ * auVar48._4_4_;
      auVar13._0_4_ = local_2400._0_4_ * auVar48._0_4_;
      auVar13._8_4_ = local_2400._8_4_ * auVar48._8_4_;
      auVar13._12_4_ = local_2400._12_4_ * auVar48._12_4_;
      auVar13._16_4_ = local_2400._16_4_ * auVar48._16_4_;
      auVar13._20_4_ = local_2400._20_4_ * auVar48._20_4_;
      auVar13._24_4_ = local_2400._24_4_ * auVar48._24_4_;
      auVar13._28_4_ = auVar48._28_4_;
      auVar64 = vfmsub231ps_fma(auVar13,auVar47,auVar86);
      uVar105 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar107._4_4_ = uVar105;
      auVar107._0_4_ = uVar105;
      auVar107._8_4_ = uVar105;
      auVar107._12_4_ = uVar105;
      auVar107._16_4_ = uVar105;
      auVar107._20_4_ = uVar105;
      auVar107._24_4_ = uVar105;
      auVar107._28_4_ = uVar105;
      local_2440 = *(float *)(ray + k * 4 + 0x60);
      auVar14._4_4_ = local_2440 * auVar64._4_4_;
      auVar14._0_4_ = local_2440 * auVar64._0_4_;
      auVar14._8_4_ = local_2440 * auVar64._8_4_;
      auVar14._12_4_ = local_2440 * auVar64._12_4_;
      auVar14._16_4_ = local_2440 * 0.0;
      auVar14._20_4_ = local_2440 * 0.0;
      auVar14._24_4_ = local_2440 * 0.0;
      auVar14._28_4_ = fVar95;
      auVar51 = vfmadd231ps_fma(auVar14,auVar107,ZEXT1632(auVar51));
      uVar105 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_2420._4_4_ = uVar105;
      local_2420._0_4_ = uVar105;
      local_2420._8_4_ = uVar105;
      local_2420._12_4_ = uVar105;
      local_2420._16_4_ = uVar105;
      local_2420._20_4_ = uVar105;
      local_2420._24_4_ = uVar105;
      local_2420._28_4_ = uVar105;
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_2420,ZEXT1632(auVar61));
      local_2460 = vsubps_avx(auVar6,auVar59);
      local_2480 = vsubps_avx(auVar53,auVar7);
      auVar55._0_4_ = auVar59._0_4_ + auVar6._0_4_;
      auVar55._4_4_ = auVar59._4_4_ + auVar6._4_4_;
      auVar55._8_4_ = auVar59._8_4_ + auVar6._8_4_;
      auVar55._12_4_ = auVar59._12_4_ + auVar6._12_4_;
      auVar55._16_4_ = auVar59._16_4_ + auVar6._16_4_;
      auVar55._20_4_ = auVar59._20_4_ + auVar6._20_4_;
      auVar55._24_4_ = auVar59._24_4_ + auVar6._24_4_;
      auVar55._28_4_ = auVar59._28_4_ + auVar6._28_4_;
      auVar71._0_4_ = fVar120 + auVar7._0_4_;
      auVar71._4_4_ = fVar127 + auVar7._4_4_;
      auVar71._8_4_ = fVar130 + auVar7._8_4_;
      auVar71._12_4_ = fVar101 + auVar7._12_4_;
      auVar71._16_4_ = fVar104 + auVar7._16_4_;
      auVar71._20_4_ = fVar113 + auVar7._20_4_;
      auVar71._24_4_ = fVar103 + auVar7._24_4_;
      fVar90 = auVar7._28_4_;
      auVar71._28_4_ = auVar53._28_4_ + fVar90;
      fVar77 = local_2480._0_4_;
      fVar80 = local_2480._4_4_;
      auVar15._4_4_ = auVar55._4_4_ * fVar80;
      auVar15._0_4_ = auVar55._0_4_ * fVar77;
      fVar109 = local_2480._8_4_;
      auVar15._8_4_ = auVar55._8_4_ * fVar109;
      fVar112 = local_2480._12_4_;
      auVar15._12_4_ = auVar55._12_4_ * fVar112;
      fVar116 = local_2480._16_4_;
      auVar15._16_4_ = auVar55._16_4_ * fVar116;
      fVar119 = local_2480._20_4_;
      auVar15._20_4_ = auVar55._20_4_ * fVar119;
      fVar124 = local_2480._24_4_;
      auVar15._24_4_ = auVar55._24_4_ * fVar124;
      auVar15._28_4_ = auVar86._28_4_;
      auVar64 = vfmsub231ps_fma(auVar15,local_2460,auVar71);
      local_24a0 = vsubps_avx(local_2980,auVar65);
      fVar78 = local_24a0._0_4_;
      fVar81 = local_24a0._4_4_;
      auVar16._4_4_ = auVar71._4_4_ * fVar81;
      auVar16._0_4_ = auVar71._0_4_ * fVar78;
      fVar110 = local_24a0._8_4_;
      auVar16._8_4_ = auVar71._8_4_ * fVar110;
      fVar114 = local_24a0._12_4_;
      auVar16._12_4_ = auVar71._12_4_ * fVar114;
      fVar117 = local_24a0._16_4_;
      auVar16._16_4_ = auVar71._16_4_ * fVar117;
      fVar122 = local_24a0._20_4_;
      auVar16._20_4_ = auVar71._20_4_ * fVar122;
      fVar125 = local_24a0._24_4_;
      auVar16._24_4_ = auVar71._24_4_ * fVar125;
      auVar16._28_4_ = auVar71._28_4_;
      auVar91._0_4_ = local_2980._0_4_ + auVar65._0_4_;
      auVar91._4_4_ = local_2980._4_4_ + auVar65._4_4_;
      auVar91._8_4_ = local_2980._8_4_ + auVar65._8_4_;
      auVar91._12_4_ = local_2980._12_4_ + auVar65._12_4_;
      auVar91._16_4_ = local_2980._16_4_ + auVar65._16_4_;
      auVar91._20_4_ = local_2980._20_4_ + auVar65._20_4_;
      auVar91._24_4_ = local_2980._24_4_ + auVar65._24_4_;
      auVar91._28_4_ = local_2980._28_4_ + auVar65._28_4_;
      auVar61 = vfmsub231ps_fma(auVar16,local_2480,auVar91);
      fVar79 = local_2460._0_4_;
      fVar82 = local_2460._4_4_;
      auVar17._4_4_ = auVar91._4_4_ * fVar82;
      auVar17._0_4_ = auVar91._0_4_ * fVar79;
      fVar111 = local_2460._8_4_;
      auVar17._8_4_ = auVar91._8_4_ * fVar111;
      fVar115 = local_2460._12_4_;
      auVar17._12_4_ = auVar91._12_4_ * fVar115;
      fVar118 = local_2460._16_4_;
      auVar17._16_4_ = auVar91._16_4_ * fVar118;
      fVar123 = local_2460._20_4_;
      auVar17._20_4_ = auVar91._20_4_ * fVar123;
      fVar126 = local_2460._24_4_;
      auVar17._24_4_ = auVar91._24_4_ * fVar126;
      auVar17._28_4_ = auVar91._28_4_;
      auVar52 = vfmsub231ps_fma(auVar17,local_24a0,auVar55);
      auVar92._0_4_ = auVar52._0_4_ * local_2440;
      auVar92._4_4_ = auVar52._4_4_ * local_2440;
      auVar92._8_4_ = auVar52._8_4_ * local_2440;
      auVar92._12_4_ = auVar52._12_4_ * local_2440;
      auVar92._16_4_ = local_2440 * 0.0;
      auVar92._20_4_ = local_2440 * 0.0;
      auVar92._24_4_ = local_2440 * 0.0;
      auVar92._28_4_ = 0;
      auVar61 = vfmadd231ps_fma(auVar92,auVar107,ZEXT1632(auVar61));
      auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),local_2420,ZEXT1632(auVar64));
      auVar11 = vsubps_avx(auVar65,auVar8);
      auVar67._0_4_ = auVar65._0_4_ + auVar8._0_4_;
      auVar67._4_4_ = auVar65._4_4_ + auVar8._4_4_;
      auVar67._8_4_ = auVar65._8_4_ + auVar8._8_4_;
      auVar67._12_4_ = auVar65._12_4_ + auVar8._12_4_;
      auVar67._16_4_ = auVar65._16_4_ + auVar8._16_4_;
      auVar67._20_4_ = auVar65._20_4_ + auVar8._20_4_;
      auVar67._24_4_ = auVar65._24_4_ + auVar8._24_4_;
      auVar67._28_4_ = auVar65._28_4_ + auVar8._28_4_;
      auVar8 = vsubps_avx(auVar59,auVar9);
      auVar76._0_4_ = auVar59._0_4_ + auVar9._0_4_;
      auVar76._4_4_ = auVar59._4_4_ + auVar9._4_4_;
      auVar76._8_4_ = auVar59._8_4_ + auVar9._8_4_;
      auVar76._12_4_ = auVar59._12_4_ + auVar9._12_4_;
      auVar76._16_4_ = auVar59._16_4_ + auVar9._16_4_;
      auVar76._20_4_ = auVar59._20_4_ + auVar9._20_4_;
      auVar76._24_4_ = auVar59._24_4_ + auVar9._24_4_;
      auVar76._28_4_ = auVar59._28_4_ + auVar9._28_4_;
      auVar9 = vsubps_avx(auVar7,auVar10);
      auVar56._0_4_ = auVar7._0_4_ + auVar10._0_4_;
      auVar56._4_4_ = auVar7._4_4_ + auVar10._4_4_;
      auVar56._8_4_ = auVar7._8_4_ + auVar10._8_4_;
      auVar56._12_4_ = auVar7._12_4_ + auVar10._12_4_;
      auVar56._16_4_ = auVar7._16_4_ + auVar10._16_4_;
      auVar56._20_4_ = auVar7._20_4_ + auVar10._20_4_;
      auVar56._24_4_ = auVar7._24_4_ + auVar10._24_4_;
      auVar56._28_4_ = fVar90 + fVar95;
      auVar18._4_4_ = auVar9._4_4_ * auVar76._4_4_;
      auVar18._0_4_ = auVar9._0_4_ * auVar76._0_4_;
      auVar18._8_4_ = auVar9._8_4_ * auVar76._8_4_;
      auVar18._12_4_ = auVar9._12_4_ * auVar76._12_4_;
      auVar18._16_4_ = auVar9._16_4_ * auVar76._16_4_;
      auVar18._20_4_ = auVar9._20_4_ * auVar76._20_4_;
      auVar18._24_4_ = auVar9._24_4_ * auVar76._24_4_;
      auVar18._28_4_ = fVar90;
      auVar52 = vfmsub231ps_fma(auVar18,auVar8,auVar56);
      auVar19._4_4_ = auVar56._4_4_ * auVar11._4_4_;
      auVar19._0_4_ = auVar56._0_4_ * auVar11._0_4_;
      auVar19._8_4_ = auVar56._8_4_ * auVar11._8_4_;
      auVar19._12_4_ = auVar56._12_4_ * auVar11._12_4_;
      auVar19._16_4_ = auVar56._16_4_ * auVar11._16_4_;
      auVar19._20_4_ = auVar56._20_4_ * auVar11._20_4_;
      auVar19._24_4_ = auVar56._24_4_ * auVar11._24_4_;
      auVar19._28_4_ = auVar56._28_4_;
      auVar64 = vfmsub231ps_fma(auVar19,auVar9,auVar67);
      auVar20._4_4_ = auVar8._4_4_ * auVar67._4_4_;
      auVar20._0_4_ = auVar8._0_4_ * auVar67._0_4_;
      auVar20._8_4_ = auVar8._8_4_ * auVar67._8_4_;
      auVar20._12_4_ = auVar8._12_4_ * auVar67._12_4_;
      auVar20._16_4_ = auVar8._16_4_ * auVar67._16_4_;
      auVar20._20_4_ = auVar8._20_4_ * auVar67._20_4_;
      auVar20._24_4_ = auVar8._24_4_ * auVar67._24_4_;
      auVar20._28_4_ = auVar67._28_4_;
      auVar74 = vfmsub231ps_fma(auVar20,auVar11,auVar76);
      fStack_243c = local_2440;
      fStack_2438 = local_2440;
      fStack_2434 = local_2440;
      fStack_2430 = local_2440;
      fStack_242c = local_2440;
      fStack_2428 = local_2440;
      fStack_2424 = local_2440;
      auVar68._0_4_ = local_2440 * auVar74._0_4_;
      auVar68._4_4_ = local_2440 * auVar74._4_4_;
      auVar68._8_4_ = local_2440 * auVar74._8_4_;
      auVar68._12_4_ = local_2440 * auVar74._12_4_;
      auVar68._16_4_ = local_2440 * 0.0;
      auVar68._20_4_ = local_2440 * 0.0;
      auVar68._24_4_ = local_2440 * 0.0;
      auVar68._28_4_ = 0;
      auVar64 = vfmadd231ps_fma(auVar68,auVar107,ZEXT1632(auVar64));
      auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),local_2420,ZEXT1632(auVar52));
      local_27e0 = ZEXT1632(auVar61);
      local_27c0 = ZEXT1632(CONCAT412(auVar64._12_4_ + auVar61._12_4_ + auVar51._12_4_,
                                      CONCAT48(auVar64._8_4_ + auVar61._8_4_ + auVar51._8_4_,
                                               CONCAT44(auVar64._4_4_ +
                                                        auVar61._4_4_ + auVar51._4_4_,
                                                        auVar64._0_4_ +
                                                        auVar61._0_4_ + auVar51._0_4_))));
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57._16_4_ = 0x7fffffff;
      auVar57._20_4_ = 0x7fffffff;
      auVar57._24_4_ = 0x7fffffff;
      auVar57._28_4_ = 0x7fffffff;
      auVar53 = vminps_avx(ZEXT1632(auVar51),local_27e0);
      auVar53 = vminps_avx(auVar53,ZEXT1632(auVar64));
      local_24e0 = vandps_avx(local_27c0,auVar57);
      fVar90 = local_24e0._0_4_ * 1.1920929e-07;
      fVar95 = local_24e0._4_4_ * 1.1920929e-07;
      auVar21._4_4_ = fVar95;
      auVar21._0_4_ = fVar90;
      fVar96 = local_24e0._8_4_ * 1.1920929e-07;
      auVar21._8_4_ = fVar96;
      fVar97 = local_24e0._12_4_ * 1.1920929e-07;
      auVar21._12_4_ = fVar97;
      fVar98 = local_24e0._16_4_ * 1.1920929e-07;
      auVar21._16_4_ = fVar98;
      fVar99 = local_24e0._20_4_ * 1.1920929e-07;
      auVar21._20_4_ = fVar99;
      fVar100 = local_24e0._24_4_ * 1.1920929e-07;
      auVar21._24_4_ = fVar100;
      auVar21._28_4_ = 0x34000000;
      auVar87._0_8_ = CONCAT44(fVar95,fVar90) ^ 0x8000000080000000;
      auVar87._8_4_ = -fVar96;
      auVar87._12_4_ = -fVar97;
      auVar87._16_4_ = -fVar98;
      auVar87._20_4_ = -fVar99;
      auVar87._24_4_ = -fVar100;
      auVar87._28_4_ = 0xb4000000;
      auVar53 = vcmpps_avx(auVar53,auVar87,5);
      local_24c0 = ZEXT1632(auVar51);
      auVar59 = vmaxps_avx(ZEXT1632(auVar51),local_27e0);
      auVar65 = vmaxps_avx(auVar59,ZEXT1632(auVar64));
      auVar65 = vcmpps_avx(auVar65,auVar21,2);
      auVar65 = vorps_avx(auVar53,auVar65);
      if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar65 >> 0x7f,0) != '\0') ||
            (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar65 >> 0xbf,0) != '\0') ||
          (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar65[0x1f] < '\0') {
        auVar22._4_4_ = fVar82 * local_23e0._4_4_;
        auVar22._0_4_ = fVar79 * local_23e0._0_4_;
        auVar22._8_4_ = fVar111 * local_23e0._8_4_;
        auVar22._12_4_ = fVar115 * local_23e0._12_4_;
        auVar22._16_4_ = fVar118 * local_23e0._16_4_;
        auVar22._20_4_ = fVar123 * local_23e0._20_4_;
        auVar22._24_4_ = fVar126 * local_23e0._24_4_;
        auVar22._28_4_ = auVar53._28_4_;
        auVar23._4_4_ = fVar81 * local_2400._4_4_;
        auVar23._0_4_ = fVar78 * local_2400._0_4_;
        auVar23._8_4_ = fVar110 * local_2400._8_4_;
        auVar23._12_4_ = fVar114 * local_2400._12_4_;
        auVar23._16_4_ = fVar117 * local_2400._16_4_;
        auVar23._20_4_ = fVar122 * local_2400._20_4_;
        auVar23._24_4_ = fVar125 * local_2400._24_4_;
        auVar23._28_4_ = 0x34000000;
        auVar64 = vfmsub213ps_fma(local_2400,local_2480,auVar22);
        auVar24._4_4_ = auVar8._4_4_ * fVar80;
        auVar24._0_4_ = auVar8._0_4_ * fVar77;
        auVar24._8_4_ = auVar8._8_4_ * fVar109;
        auVar24._12_4_ = auVar8._12_4_ * fVar112;
        auVar24._16_4_ = auVar8._16_4_ * fVar116;
        auVar24._20_4_ = auVar8._20_4_ * fVar119;
        auVar24._24_4_ = auVar8._24_4_ * fVar124;
        auVar24._28_4_ = auVar59._28_4_;
        auVar25._4_4_ = fVar81 * auVar9._4_4_;
        auVar25._0_4_ = fVar78 * auVar9._0_4_;
        auVar25._8_4_ = fVar110 * auVar9._8_4_;
        auVar25._12_4_ = fVar114 * auVar9._12_4_;
        auVar25._16_4_ = fVar117 * auVar9._16_4_;
        auVar25._20_4_ = fVar122 * auVar9._20_4_;
        auVar25._24_4_ = fVar125 * auVar9._24_4_;
        auVar25._28_4_ = local_24e0._28_4_;
        auVar52 = vfmsub213ps_fma(auVar9,local_2460,auVar24);
        auVar53 = vandps_avx(auVar22,auVar57);
        auVar59 = vandps_avx(auVar24,auVar57);
        auVar53 = vcmpps_avx(auVar53,auVar59,1);
        local_27a0 = vblendvps_avx(ZEXT1632(auVar52),ZEXT1632(auVar64),auVar53);
        auVar26._4_4_ = fVar82 * auVar11._4_4_;
        auVar26._0_4_ = fVar79 * auVar11._0_4_;
        auVar26._8_4_ = fVar111 * auVar11._8_4_;
        auVar26._12_4_ = fVar115 * auVar11._12_4_;
        auVar26._16_4_ = fVar118 * auVar11._16_4_;
        auVar26._20_4_ = fVar123 * auVar11._20_4_;
        auVar26._24_4_ = fVar126 * auVar11._24_4_;
        auVar26._28_4_ = auVar53._28_4_;
        auVar64 = vfmsub213ps_fma(auVar11,local_2480,auVar25);
        auVar27._4_4_ = auVar47._4_4_ * fVar80;
        auVar27._0_4_ = auVar47._0_4_ * fVar77;
        auVar27._8_4_ = auVar47._8_4_ * fVar109;
        auVar27._12_4_ = auVar47._12_4_ * fVar112;
        auVar27._16_4_ = auVar47._16_4_ * fVar116;
        auVar27._20_4_ = auVar47._20_4_ * fVar119;
        auVar27._24_4_ = auVar47._24_4_ * fVar124;
        auVar27._28_4_ = auVar59._28_4_;
        auVar52 = vfmsub213ps_fma(local_23e0,local_24a0,auVar27);
        auVar53 = vandps_avx(auVar27,auVar57);
        auVar59 = vandps_avx(auVar25,auVar57);
        auVar53 = vcmpps_avx(auVar53,auVar59,1);
        local_2780 = vblendvps_avx(ZEXT1632(auVar64),ZEXT1632(auVar52),auVar53);
        auVar64 = vfmsub213ps_fma(auVar47,local_2460,auVar23);
        auVar52 = vfmsub213ps_fma(auVar8,local_24a0,auVar26);
        auVar53 = vandps_avx(auVar23,auVar57);
        auVar59 = vandps_avx(auVar26,auVar57);
        auVar59 = vcmpps_avx(auVar53,auVar59,1);
        local_2760 = vblendvps_avx(ZEXT1632(auVar52),ZEXT1632(auVar64),auVar59);
        auVar64 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
        fVar90 = local_2760._0_4_;
        auVar58._0_4_ = fVar90 * local_2440;
        fVar77 = local_2760._4_4_;
        auVar58._4_4_ = fVar77 * local_2440;
        fVar78 = local_2760._8_4_;
        auVar58._8_4_ = fVar78 * local_2440;
        fVar79 = local_2760._12_4_;
        auVar58._12_4_ = fVar79 * local_2440;
        fVar80 = local_2760._16_4_;
        auVar58._16_4_ = fVar80 * local_2440;
        fVar81 = local_2760._20_4_;
        auVar58._20_4_ = fVar81 * local_2440;
        fVar82 = local_2760._24_4_;
        auVar58._24_4_ = fVar82 * local_2440;
        auVar58._28_4_ = 0;
        auVar52 = vfmadd213ps_fma(auVar107,local_2780,auVar58);
        auVar52 = vfmadd213ps_fma(local_2420,local_27a0,ZEXT1632(auVar52));
        auVar59 = ZEXT1632(CONCAT412(auVar52._12_4_ + auVar52._12_4_,
                                     CONCAT48(auVar52._8_4_ + auVar52._8_4_,
                                              CONCAT44(auVar52._4_4_ + auVar52._4_4_,
                                                       auVar52._0_4_ + auVar52._0_4_))));
        auVar28._4_4_ = fVar77 * fVar127;
        auVar28._0_4_ = fVar90 * fVar120;
        auVar28._8_4_ = fVar78 * fVar130;
        auVar28._12_4_ = fVar79 * fVar101;
        auVar28._16_4_ = fVar80 * fVar104;
        auVar28._20_4_ = fVar81 * fVar113;
        auVar28._24_4_ = fVar82 * fVar103;
        auVar28._28_4_ = auVar53._28_4_;
        auVar52 = vfmadd213ps_fma(auVar6,local_2780,auVar28);
        auVar74 = vfmadd213ps_fma(local_2980,local_27a0,ZEXT1632(auVar52));
        auVar53 = vrcpps_avx(auVar59);
        auVar102._8_4_ = 0x3f800000;
        auVar102._0_8_ = 0x3f8000003f800000;
        auVar102._12_4_ = 0x3f800000;
        auVar102._16_4_ = 0x3f800000;
        auVar102._20_4_ = 0x3f800000;
        auVar102._24_4_ = 0x3f800000;
        auVar102._28_4_ = 0x3f800000;
        auVar52 = vfnmadd213ps_fma(auVar53,auVar59,auVar102);
        auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar53,auVar53);
        local_26e0._28_4_ = 0x3f800000;
        local_26e0._0_28_ =
             ZEXT1628(CONCAT412(auVar52._12_4_ * (auVar74._12_4_ + auVar74._12_4_),
                                CONCAT48(auVar52._8_4_ * (auVar74._8_4_ + auVar74._8_4_),
                                         CONCAT44(auVar52._4_4_ * (auVar74._4_4_ + auVar74._4_4_),
                                                  auVar52._0_4_ * (auVar74._0_4_ + auVar74._0_4_))))
                     );
        auVar50 = ZEXT3264(local_26e0);
        uVar105 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar72._4_4_ = uVar105;
        auVar72._0_4_ = uVar105;
        auVar72._8_4_ = uVar105;
        auVar72._12_4_ = uVar105;
        auVar72._16_4_ = uVar105;
        auVar72._20_4_ = uVar105;
        auVar72._24_4_ = uVar105;
        auVar72._28_4_ = uVar105;
        uVar105 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar108._4_4_ = uVar105;
        auVar108._0_4_ = uVar105;
        auVar108._8_4_ = uVar105;
        auVar108._12_4_ = uVar105;
        auVar108._16_4_ = uVar105;
        auVar108._20_4_ = uVar105;
        auVar108._24_4_ = uVar105;
        auVar108._28_4_ = uVar105;
        auVar84 = ZEXT3264(auVar108);
        auVar53 = vcmpps_avx(auVar72,local_26e0,2);
        auVar65 = vcmpps_avx(local_26e0,auVar108,2);
        auVar53 = vandps_avx(auVar65,auVar53);
        auVar52 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
        auVar64 = vpand_avx(auVar52,auVar64);
        auVar53 = vpmovsxwd_avx2(auVar64);
        if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar53 >> 0x7f,0) != '\0') ||
              (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0xbf,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar53[0x1f] < '\0') {
          auVar53 = vcmpps_avx(auVar59,_DAT_01f7b000,4);
          auVar52 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
          auVar64 = vpand_avx(auVar64,auVar52);
          local_2960 = vpmovsxwd_avx2(auVar64);
          if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_2960 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_2960 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_2960 >> 0x7f,0) != '\0') ||
                (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_2960 >> 0xbf,0) != '\0') ||
              (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_2960[0x1f] < '\0') {
            local_2800 = ZEXT1632(auVar51);
            local_2740 = local_2960;
            local_2660 = local_2620;
            pSVar39 = context->scene;
            auVar53 = vrcpps_avx(local_27c0);
            auVar93._8_4_ = 0x3f800000;
            auVar93._0_8_ = 0x3f8000003f800000;
            auVar93._12_4_ = 0x3f800000;
            auVar93._16_4_ = 0x3f800000;
            auVar93._20_4_ = 0x3f800000;
            auVar93._24_4_ = 0x3f800000;
            auVar93._28_4_ = 0x3f800000;
            auVar52 = vfnmadd213ps_fma(local_27c0,auVar53,auVar93);
            auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar53,auVar53);
            auVar73._8_4_ = 0x219392ef;
            auVar73._0_8_ = 0x219392ef219392ef;
            auVar73._12_4_ = 0x219392ef;
            auVar73._16_4_ = 0x219392ef;
            auVar73._20_4_ = 0x219392ef;
            auVar73._24_4_ = 0x219392ef;
            auVar73._28_4_ = 0x219392ef;
            auVar53 = vcmpps_avx(local_24e0,auVar73,5);
            auVar53 = vandps_avx(auVar53,ZEXT1632(auVar52));
            auVar29._4_4_ = auVar51._4_4_ * auVar53._4_4_;
            auVar29._0_4_ = auVar51._0_4_ * auVar53._0_4_;
            auVar29._8_4_ = auVar51._8_4_ * auVar53._8_4_;
            auVar29._12_4_ = auVar51._12_4_ * auVar53._12_4_;
            auVar29._16_4_ = auVar53._16_4_ * 0.0;
            auVar29._20_4_ = auVar53._20_4_ * 0.0;
            auVar29._24_4_ = auVar53._24_4_ * 0.0;
            auVar29._28_4_ = 0;
            auVar65 = vminps_avx(auVar29,auVar93);
            auVar30._4_4_ = auVar61._4_4_ * auVar53._4_4_;
            auVar30._0_4_ = auVar61._0_4_ * auVar53._0_4_;
            auVar30._8_4_ = auVar61._8_4_ * auVar53._8_4_;
            auVar30._12_4_ = auVar61._12_4_ * auVar53._12_4_;
            auVar30._16_4_ = auVar53._16_4_ * 0.0;
            auVar30._20_4_ = auVar53._20_4_ * 0.0;
            auVar30._24_4_ = auVar53._24_4_ * 0.0;
            auVar30._28_4_ = local_2480._28_4_;
            auVar53 = vminps_avx(auVar30,auVar93);
            auVar59 = vsubps_avx(auVar93,auVar65);
            auVar7 = vsubps_avx(auVar93,auVar53);
            local_2700 = vblendvps_avx(auVar53,auVar59,local_2620);
            local_2720 = vblendvps_avx(auVar65,auVar7,local_2620);
            local_26c0[0] = local_27a0._0_4_ * (float)local_2640._0_4_;
            local_26c0[1] = local_27a0._4_4_ * (float)local_2640._4_4_;
            local_26c0[2] = local_27a0._8_4_ * fStack_2638;
            local_26c0[3] = local_27a0._12_4_ * fStack_2634;
            fStack_26b0 = local_27a0._16_4_ * fStack_2630;
            fStack_26ac = local_27a0._20_4_ * fStack_262c;
            fStack_26a8 = local_27a0._24_4_ * fStack_2628;
            uStack_26a4 = local_2720._28_4_;
            local_26a0[0] = (float)local_2640._0_4_ * local_2780._0_4_;
            local_26a0[1] = (float)local_2640._4_4_ * local_2780._4_4_;
            local_26a0[2] = fStack_2638 * local_2780._8_4_;
            local_26a0[3] = fStack_2634 * local_2780._12_4_;
            fStack_2690 = fStack_2630 * local_2780._16_4_;
            fStack_268c = fStack_262c * local_2780._20_4_;
            fStack_2688 = fStack_2628 * local_2780._24_4_;
            uStack_2684 = local_2700._28_4_;
            local_2680[0] = (float)local_2640._0_4_ * fVar90;
            local_2680[1] = (float)local_2640._4_4_ * fVar77;
            local_2680[2] = fStack_2638 * fVar78;
            local_2680[3] = fStack_2634 * fVar79;
            fStack_2670 = fStack_2630 * fVar80;
            fStack_266c = fStack_262c * fVar81;
            fStack_2668 = fStack_2628 * fVar82;
            uStack_2664 = uStack_2624;
            auVar53 = vpmovsxwd_avx2(auVar64);
            auVar63._8_4_ = 0x7f800000;
            auVar63._0_8_ = 0x7f8000007f800000;
            auVar63._12_4_ = 0x7f800000;
            auVar63._16_4_ = 0x7f800000;
            auVar63._20_4_ = 0x7f800000;
            auVar63._24_4_ = 0x7f800000;
            auVar63._28_4_ = 0x7f800000;
            auVar53 = vblendvps_avx(auVar63,local_26e0,auVar53);
            auVar65 = vshufps_avx(auVar53,auVar53,0xb1);
            auVar65 = vminps_avx(auVar53,auVar65);
            auVar59 = vshufpd_avx(auVar65,auVar65,5);
            auVar65 = vminps_avx(auVar65,auVar59);
            auVar59 = vpermpd_avx2(auVar65,0x4e);
            auVar65 = vminps_avx(auVar65,auVar59);
            auVar53 = vcmpps_avx(auVar53,auVar65,0);
            auVar51 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
            auVar51 = vpand_avx(auVar51,auVar64);
            auVar53 = vpmovsxwd_avx2(auVar51);
            if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar53 >> 0x7f,0) == '\0') &&
                  (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar53 >> 0xbf,0) == '\0') &&
                (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar53[0x1f]) {
              auVar53 = local_2960;
            }
            uVar32 = vmovmskps_avx(auVar53);
            uVar31 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
              uVar31 = uVar31 + 1;
            }
            auVar51 = vpcmpeqd_avx(local_2780._0_16_,local_2780._0_16_);
            auVar88 = ZEXT1664(auVar51);
            auStack_28f8 = auVar6._8_24_;
            local_2900 = pSVar39;
            do {
              uVar40 = CONCAT44(0,uVar31);
              uVar31 = *(uint *)((long)&local_23c0 + uVar40 * 4);
              pGVar4 = (pSVar39->geometries).items[uVar31].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2960 + uVar40 * 4) = 0;
                pSVar39 = local_2900;
              }
              else {
                local_2980._0_8_ = uVar40;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar105 = *(undefined4 *)(local_2720 + uVar40 * 4);
                  uVar2 = *(undefined4 *)(local_2700 + uVar40 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_26e0 + uVar40 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = local_26c0[uVar40];
                  *(float *)(ray + k * 4 + 0xd0) = local_26a0[uVar40];
                  *(float *)(ray + k * 4 + 0xe0) = local_2680[uVar40];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar105;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_28c0 + uVar40 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar31;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar105 = *(undefined4 *)(local_2720 + uVar40 * 4);
                local_2860._4_4_ = uVar105;
                local_2860._0_4_ = uVar105;
                local_2860._8_4_ = uVar105;
                local_2860._12_4_ = uVar105;
                local_2850 = *(undefined4 *)(local_2700 + uVar40 * 4);
                local_2830._4_4_ = uVar31;
                local_2830._0_4_ = uVar31;
                local_2830._8_4_ = uVar31;
                local_2830._12_4_ = uVar31;
                uVar105 = *(undefined4 *)((long)&local_28c0 + uVar40 * 4);
                local_2840._4_4_ = uVar105;
                local_2840._0_4_ = uVar105;
                local_2840._8_4_ = uVar105;
                local_2840._12_4_ = uVar105;
                fVar120 = local_26c0[uVar40];
                fVar127 = local_26a0[uVar40];
                local_2880._4_4_ = fVar127;
                local_2880._0_4_ = fVar127;
                local_2880._8_4_ = fVar127;
                local_2880._12_4_ = fVar127;
                fVar127 = local_2680[uVar40];
                local_2870._4_4_ = fVar127;
                local_2870._0_4_ = fVar127;
                local_2870._8_4_ = fVar127;
                local_2870._12_4_ = fVar127;
                local_2890[0] = (RTCHitN)SUB41(fVar120,0);
                local_2890[1] = (RTCHitN)(char)((uint)fVar120 >> 8);
                local_2890[2] = (RTCHitN)(char)((uint)fVar120 >> 0x10);
                local_2890[3] = (RTCHitN)(char)((uint)fVar120 >> 0x18);
                local_2890[4] = (RTCHitN)SUB41(fVar120,0);
                local_2890[5] = (RTCHitN)(char)((uint)fVar120 >> 8);
                local_2890[6] = (RTCHitN)(char)((uint)fVar120 >> 0x10);
                local_2890[7] = (RTCHitN)(char)((uint)fVar120 >> 0x18);
                local_2890[8] = (RTCHitN)SUB41(fVar120,0);
                local_2890[9] = (RTCHitN)(char)((uint)fVar120 >> 8);
                local_2890[10] = (RTCHitN)(char)((uint)fVar120 >> 0x10);
                local_2890[0xb] = (RTCHitN)(char)((uint)fVar120 >> 0x18);
                local_2890[0xc] = (RTCHitN)SUB41(fVar120,0);
                local_2890[0xd] = (RTCHitN)(char)((uint)fVar120 >> 8);
                local_2890[0xe] = (RTCHitN)(char)((uint)fVar120 >> 0x10);
                local_2890[0xf] = (RTCHitN)(char)((uint)fVar120 >> 0x18);
                uStack_284c = local_2850;
                uStack_2848 = local_2850;
                uStack_2844 = local_2850;
                vpcmpeqd_avx2(ZEXT1632(local_2860),ZEXT1632(local_2860));
                uStack_281c = context->user->instID[0];
                local_2820 = uStack_281c;
                uStack_2818 = uStack_281c;
                uStack_2814 = uStack_281c;
                uStack_2810 = context->user->instPrimID[0];
                uStack_280c = uStack_2810;
                uStack_2808 = uStack_2810;
                uStack_2804 = uStack_2810;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_26e0 + uVar40 * 4);
                local_29e0 = *local_29c8;
                local_29b0.valid = (int *)local_29e0;
                local_29b0.geometryUserPtr = pGVar4->userPtr;
                local_29b0.context = context->user;
                local_29b0.hit = local_2890;
                local_29b0.N = 4;
                local_2920 = auVar50._0_32_;
                local_2940 = auVar84._0_32_;
                local_29b0.ray = (RTCRayN *)ray;
                if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar51 = auVar88._0_16_;
                  (*pGVar4->intersectionFilterN)(&local_29b0);
                  auVar84 = ZEXT3264(local_2940);
                  auVar50 = ZEXT3264(local_2920);
                  auVar51 = vpcmpeqd_avx(auVar51,auVar51);
                  auVar88 = ZEXT1664(auVar51);
                }
                auVar51 = auVar88._0_16_;
                if (local_29e0 == (undefined1  [16])0x0) {
                  auVar61 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar61 = auVar61 ^ auVar51;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_29b0);
                    auVar84 = ZEXT3264(local_2940);
                    auVar50 = ZEXT3264(local_2920);
                    auVar51 = vpcmpeqd_avx(auVar51,auVar51);
                    auVar88 = ZEXT1664(auVar51);
                  }
                  auVar51 = vpcmpeqd_avx(local_29e0,_DAT_01f45a50);
                  auVar61 = auVar51 ^ auVar88._0_16_;
                  if (local_29e0 != (undefined1  [16])0x0) {
                    auVar51 = auVar51 ^ auVar88._0_16_;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])local_29b0.hit);
                    *(undefined1 (*) [16])(local_29b0.ray + 0xc0) = auVar64;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x10));
                    *(undefined1 (*) [16])(local_29b0.ray + 0xd0) = auVar64;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x20));
                    *(undefined1 (*) [16])(local_29b0.ray + 0xe0) = auVar64;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x30));
                    *(undefined1 (*) [16])(local_29b0.ray + 0xf0) = auVar64;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x40));
                    *(undefined1 (*) [16])(local_29b0.ray + 0x100) = auVar64;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x50));
                    *(undefined1 (*) [16])(local_29b0.ray + 0x110) = auVar64;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x60));
                    *(undefined1 (*) [16])(local_29b0.ray + 0x120) = auVar64;
                    auVar64 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x70));
                    *(undefined1 (*) [16])(local_29b0.ray + 0x130) = auVar64;
                    auVar51 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_29b0.hit + 0x80));
                    *(undefined1 (*) [16])(local_29b0.ray + 0x140) = auVar51;
                  }
                }
                auVar46._8_8_ = 0x100000001;
                auVar46._0_8_ = 0x100000001;
                pSVar39 = local_2900;
                if ((auVar46 & auVar61) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar84._0_4_;
                }
                else {
                  auVar84 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2960 + local_2980._0_8_ * 4) = 0;
                uVar105 = auVar84._0_4_;
                auVar49._4_4_ = uVar105;
                auVar49._0_4_ = uVar105;
                auVar49._8_4_ = uVar105;
                auVar49._12_4_ = uVar105;
                auVar49._16_4_ = uVar105;
                auVar49._20_4_ = uVar105;
                auVar49._24_4_ = uVar105;
                auVar49._28_4_ = uVar105;
                auVar53 = vcmpps_avx(auVar50._0_32_,auVar49,2);
                local_2960 = vandps_avx(auVar53,local_2960);
              }
              if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2960 >> 0x7f,0) == '\0') &&
                    (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2960 >> 0xbf,0) == '\0') &&
                  (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2960[0x1f]) break;
              auVar60._8_4_ = 0x7f800000;
              auVar60._0_8_ = 0x7f8000007f800000;
              auVar60._12_4_ = 0x7f800000;
              auVar60._16_4_ = 0x7f800000;
              auVar60._20_4_ = 0x7f800000;
              auVar60._24_4_ = 0x7f800000;
              auVar60._28_4_ = 0x7f800000;
              auVar53 = vblendvps_avx(auVar60,auVar50._0_32_,local_2960);
              auVar65 = vshufps_avx(auVar53,auVar53,0xb1);
              auVar65 = vminps_avx(auVar53,auVar65);
              auVar59 = vshufpd_avx(auVar65,auVar65,5);
              auVar65 = vminps_avx(auVar65,auVar59);
              auVar59 = vpermpd_avx2(auVar65,0x4e);
              auVar65 = vminps_avx(auVar65,auVar59);
              auVar65 = vcmpps_avx(auVar53,auVar65,0);
              auVar59 = local_2960 & auVar65;
              auVar53 = local_2960;
              if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar59 >> 0x7f,0) != '\0') ||
                    (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar59 >> 0xbf,0) != '\0') ||
                  (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar59[0x1f] < '\0') {
                auVar53 = vandps_avx(auVar65,local_2960);
              }
              uVar32 = vmovmskps_avx(auVar53);
              uVar31 = 0;
              for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                uVar31 = uVar31 + 1;
              }
            } while( true );
          }
        }
      }
      auVar88 = ZEXT3264(local_2500);
      auVar89 = ZEXT3264(local_2520);
      auVar94 = ZEXT3264(local_2540);
      auVar84 = ZEXT3264(local_28e0);
      fVar101 = local_2560;
      fVar103 = fStack_255c;
      fVar90 = fStack_2558;
      fVar77 = fStack_2554;
      fVar78 = fStack_2550;
      fVar79 = fStack_254c;
      fVar80 = fStack_2548;
      fVar104 = local_2580;
      fVar81 = fStack_257c;
      fVar82 = fStack_2578;
      fVar109 = fStack_2574;
      fVar110 = fStack_2570;
      fVar111 = fStack_256c;
      fVar112 = fStack_2568;
      fVar113 = local_25a0;
      fVar114 = fStack_259c;
      fVar115 = fStack_2598;
      fVar116 = fStack_2594;
      fVar117 = fStack_2590;
      fVar118 = fStack_258c;
      fVar119 = fStack_2588;
      fVar120 = local_25c0;
      fVar122 = fStack_25bc;
      fVar123 = fStack_25b8;
      fVar124 = fStack_25b4;
      fVar125 = fStack_25b0;
      fVar126 = fStack_25ac;
      fVar95 = fStack_25a8;
      fVar127 = local_25e0;
      fVar96 = fStack_25dc;
      fVar97 = fStack_25d8;
      fVar98 = fStack_25d4;
      fVar99 = fStack_25d0;
      fVar100 = fStack_25cc;
      fVar129 = fStack_25c8;
      fVar130 = local_2600;
      fVar132 = fStack_25fc;
      fVar133 = fStack_25f8;
      fVar134 = fStack_25f4;
      fVar135 = fStack_25f0;
      fVar136 = fStack_25ec;
      fVar137 = fStack_25e8;
    }
    uVar105 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar50 = ZEXT3264(CONCAT428(uVar105,CONCAT424(uVar105,CONCAT420(uVar105,CONCAT416(uVar105,
                                                  CONCAT412(uVar105,CONCAT48(uVar105,CONCAT44(
                                                  uVar105,uVar105))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }